

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjExporter.cpp
# Opt level: O0

void __thiscall Assimp::ObjExporter::WriteMaterialFile(ObjExporter *this)

{
  aiReturn aVar1;
  ostream *poVar2;
  undefined1 local_46c [8];
  aiString s;
  ai_real o;
  aiColor4D c;
  string local_48;
  int local_24;
  aiMaterial *paStack_20;
  int illum;
  aiMaterial *mat;
  ObjExporter *pOStack_10;
  uint i;
  ObjExporter *this_local;
  
  pOStack_10 = this;
  WriteHeader(this,&this->mOutputMat);
  for (mat._4_4_ = 0; mat._4_4_ < this->pScene->mNumMaterials; mat._4_4_ = mat._4_4_ + 1) {
    paStack_20 = this->pScene->mMaterials[mat._4_4_];
    local_24 = 1;
    poVar2 = std::operator<<((ostream *)&this->mOutputMat,"newmtl ");
    GetMaterialName_abi_cxx11_(&local_48,this,mat._4_4_);
    poVar2 = std::operator<<(poVar2,(string *)&local_48);
    std::operator<<(poVar2,(string *)&this->endl);
    std::__cxx11::string::~string((string *)&local_48);
    aiColor4t<float>::aiColor4t((aiColor4t<float> *)(s.data + 0x3fc));
    aVar1 = aiMaterial::Get(paStack_20,"$clr.diffuse",0,0,(aiColor4D *)(s.data + 0x3fc));
    if (aVar1 == aiReturn_SUCCESS) {
      poVar2 = std::operator<<((ostream *)&this->mOutputMat,"Kd ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(float)s.data._1020_4_);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,o);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,c.r);
      std::operator<<(poVar2,(string *)&this->endl);
    }
    aVar1 = aiMaterial::Get(paStack_20,"$clr.ambient",0,0,(aiColor4D *)(s.data + 0x3fc));
    if (aVar1 == aiReturn_SUCCESS) {
      poVar2 = std::operator<<((ostream *)&this->mOutputMat,"Ka ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(float)s.data._1020_4_);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,o);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,c.r);
      std::operator<<(poVar2,(string *)&this->endl);
    }
    aVar1 = aiMaterial::Get(paStack_20,"$clr.specular",0,0,(aiColor4D *)(s.data + 0x3fc));
    if (aVar1 == aiReturn_SUCCESS) {
      poVar2 = std::operator<<((ostream *)&this->mOutputMat,"Ks ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(float)s.data._1020_4_);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,o);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,c.r);
      std::operator<<(poVar2,(string *)&this->endl);
    }
    aVar1 = aiMaterial::Get(paStack_20,"$clr.emissive",0,0,(aiColor4D *)(s.data + 0x3fc));
    if (aVar1 == aiReturn_SUCCESS) {
      poVar2 = std::operator<<((ostream *)&this->mOutputMat,"Ke ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(float)s.data._1020_4_);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,o);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,c.r);
      std::operator<<(poVar2,(string *)&this->endl);
    }
    aVar1 = aiMaterial::Get(paStack_20,"$clr.transparent",0,0,(aiColor4D *)(s.data + 0x3fc));
    if (aVar1 == aiReturn_SUCCESS) {
      poVar2 = std::operator<<((ostream *)&this->mOutputMat,"Tf ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(float)s.data._1020_4_);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,o);
      poVar2 = std::operator<<(poVar2," ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,c.r);
      std::operator<<(poVar2,(string *)&this->endl);
    }
    aVar1 = aiMaterial::Get(paStack_20,"$mat.opacity",0,0,(ai_real *)(s.data + 0x3f8));
    if (aVar1 == aiReturn_SUCCESS) {
      poVar2 = std::operator<<((ostream *)&this->mOutputMat,"d ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(float)s.data._1016_4_);
      std::operator<<(poVar2,(string *)&this->endl);
    }
    aVar1 = aiMaterial::Get(paStack_20,"$mat.refracti",0,0,(ai_real *)(s.data + 0x3f8));
    if (aVar1 == aiReturn_SUCCESS) {
      poVar2 = std::operator<<((ostream *)&this->mOutputMat,"Ni ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(float)s.data._1016_4_);
      std::operator<<(poVar2,(string *)&this->endl);
    }
    aVar1 = aiMaterial::Get(paStack_20,"$mat.shininess",0,0,(ai_real *)(s.data + 0x3f8));
    if ((aVar1 == aiReturn_SUCCESS) &&
       (((float)s.data._1016_4_ != 0.0 || (NAN((float)s.data._1016_4_))))) {
      poVar2 = std::operator<<((ostream *)&this->mOutputMat,"Ns ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(float)s.data._1016_4_);
      std::operator<<(poVar2,(string *)&this->endl);
      local_24 = 2;
    }
    poVar2 = std::operator<<((ostream *)&this->mOutputMat,"illum ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_24);
    std::operator<<(poVar2,(string *)&this->endl);
    aiString::aiString((aiString *)local_46c);
    aVar1 = aiMaterial::Get(paStack_20,"$tex.file",1,0,(aiString *)local_46c);
    if (aVar1 == aiReturn_SUCCESS) {
      poVar2 = std::operator<<((ostream *)&this->mOutputMat,"map_Kd ");
      poVar2 = std::operator<<(poVar2,local_46c + 4);
      std::operator<<(poVar2,(string *)&this->endl);
    }
    aVar1 = aiMaterial::Get(paStack_20,"$tex.file",3,0,(aiString *)local_46c);
    if (aVar1 == aiReturn_SUCCESS) {
      poVar2 = std::operator<<((ostream *)&this->mOutputMat,"map_Ka ");
      poVar2 = std::operator<<(poVar2,local_46c + 4);
      std::operator<<(poVar2,(string *)&this->endl);
    }
    aVar1 = aiMaterial::Get(paStack_20,"$tex.file",2,0,(aiString *)local_46c);
    if (aVar1 == aiReturn_SUCCESS) {
      poVar2 = std::operator<<((ostream *)&this->mOutputMat,"map_Ks ");
      poVar2 = std::operator<<(poVar2,local_46c + 4);
      std::operator<<(poVar2,(string *)&this->endl);
    }
    aVar1 = aiMaterial::Get(paStack_20,"$tex.file",7,0,(aiString *)local_46c);
    if (aVar1 == aiReturn_SUCCESS) {
      poVar2 = std::operator<<((ostream *)&this->mOutputMat,"map_Ns ");
      poVar2 = std::operator<<(poVar2,local_46c + 4);
      std::operator<<(poVar2,(string *)&this->endl);
    }
    aVar1 = aiMaterial::Get(paStack_20,"$tex.file",8,0,(aiString *)local_46c);
    if (aVar1 == aiReturn_SUCCESS) {
      poVar2 = std::operator<<((ostream *)&this->mOutputMat,"map_d ");
      poVar2 = std::operator<<(poVar2,local_46c + 4);
      std::operator<<(poVar2,(string *)&this->endl);
    }
    aVar1 = aiMaterial::Get(paStack_20,"$tex.file",5,0,(aiString *)local_46c);
    if ((aVar1 == aiReturn_SUCCESS) ||
       (aVar1 = aiMaterial::Get(paStack_20,"$tex.file",6,0,(aiString *)local_46c),
       aVar1 == aiReturn_SUCCESS)) {
      poVar2 = std::operator<<((ostream *)&this->mOutputMat,"bump ");
      poVar2 = std::operator<<(poVar2,local_46c + 4);
      std::operator<<(poVar2,(string *)&this->endl);
      poVar2 = std::operator<<((ostream *)&this->mOutputMat,"map_bump ");
      poVar2 = std::operator<<(poVar2,local_46c + 4);
      std::operator<<(poVar2,(string *)&this->endl);
    }
    std::operator<<((ostream *)&this->mOutputMat,(string *)&this->endl);
  }
  return;
}

Assistant:

void ObjExporter::WriteMaterialFile() {
    WriteHeader(mOutputMat);

    for(unsigned int i = 0; i < pScene->mNumMaterials; ++i) {
        const aiMaterial* const mat = pScene->mMaterials[i];

        int illum = 1;
        mOutputMat << "newmtl " << GetMaterialName(i)  << endl;

        aiColor4D c;
        if(AI_SUCCESS == mat->Get(AI_MATKEY_COLOR_DIFFUSE,c)) {
            mOutputMat << "Kd " << c.r << " " << c.g << " " << c.b << endl;
        }
        if(AI_SUCCESS == mat->Get(AI_MATKEY_COLOR_AMBIENT,c)) {
            mOutputMat << "Ka " << c.r << " " << c.g << " " << c.b << endl;
        }
        if(AI_SUCCESS == mat->Get(AI_MATKEY_COLOR_SPECULAR,c)) {
            mOutputMat << "Ks " << c.r << " " << c.g << " " << c.b << endl;
        }
        if(AI_SUCCESS == mat->Get(AI_MATKEY_COLOR_EMISSIVE,c)) {
            mOutputMat << "Ke " << c.r << " " << c.g << " " << c.b << endl;
        }
        if(AI_SUCCESS == mat->Get(AI_MATKEY_COLOR_TRANSPARENT,c)) {
            mOutputMat << "Tf " << c.r << " " << c.g << " " << c.b << endl;
        }

        ai_real o;
        if(AI_SUCCESS == mat->Get(AI_MATKEY_OPACITY,o)) {
            mOutputMat << "d " << o << endl;
        }
        if(AI_SUCCESS == mat->Get(AI_MATKEY_REFRACTI,o)) {
            mOutputMat << "Ni " << o << endl;
        }

        if(AI_SUCCESS == mat->Get(AI_MATKEY_SHININESS,o) && o) {
            mOutputMat << "Ns " << o << endl;
            illum = 2;
        }

        mOutputMat << "illum " << illum << endl;

        aiString s;
        if(AI_SUCCESS == mat->Get(AI_MATKEY_TEXTURE_DIFFUSE(0),s)) {
            mOutputMat << "map_Kd " << s.data << endl;
        }
        if(AI_SUCCESS == mat->Get(AI_MATKEY_TEXTURE_AMBIENT(0),s)) {
            mOutputMat << "map_Ka " << s.data << endl;
        }
        if(AI_SUCCESS == mat->Get(AI_MATKEY_TEXTURE_SPECULAR(0),s)) {
            mOutputMat << "map_Ks " << s.data << endl;
        }
        if(AI_SUCCESS == mat->Get(AI_MATKEY_TEXTURE_SHININESS(0),s)) {
            mOutputMat << "map_Ns " << s.data << endl;
        }
        if(AI_SUCCESS == mat->Get(AI_MATKEY_TEXTURE_OPACITY(0),s)) {
            mOutputMat << "map_d " << s.data << endl;
        }
        if(AI_SUCCESS == mat->Get(AI_MATKEY_TEXTURE_HEIGHT(0),s) || AI_SUCCESS == mat->Get(AI_MATKEY_TEXTURE_NORMALS(0),s)) {
            // implementations seem to vary here, so write both variants
            mOutputMat << "bump " << s.data << endl;
            mOutputMat << "map_bump " << s.data << endl;
        }

        mOutputMat << endl;
    }
}